

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_e23c::AudioState::~AudioState(AudioState *this)

{
  deque<AVPacket,_std::allocator<AVPacket>_> *this_00;
  uchar *puVar1;
  _Elt_pointer pAVar2;
  _Map_pointer ppAVar3;
  _Elt_pointer pAVar4;
  _Elt_pointer pAVar5;
  
  if (this->mSource != 0) {
    alDeleteSources(1,&this->mSource);
  }
  if ((this->mBuffers)._M_elems[0] != 0) {
    alDeleteBuffers(0x28,&this->mBuffers);
  }
  av_freep(&this->mSamples);
  std::condition_variable::~condition_variable(&this->mSrcCond);
  puVar1 = (this->mBufferData)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  (this->mBufferData)._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if ((this->mSwresCtx)._M_t.
      super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>._M_t.
      super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
      super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl != (SwrContext *)0x0) {
    swr_free();
  }
  (this->mSwresCtx)._M_t.super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>
  ._M_t.super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
  super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl = (SwrContext *)0x0;
  std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::~unique_ptr(&this->mDecodedFrame)
  ;
  pAVar5 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pAVar2 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pAVar5 != pAVar2) {
    pAVar4 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppAVar3 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      av_packet_unref(pAVar5);
      pAVar5 = pAVar5 + 1;
      if (pAVar5 == pAVar4) {
        pAVar5 = ppAVar3[1];
        ppAVar3 = ppAVar3 + 1;
        pAVar4 = pAVar5 + 5;
      }
    } while (pAVar5 != pAVar2);
  }
  this_00 = &(this->mPackets).mPackets;
  std::deque<AVPacket,_std::allocator<AVPacket>_>::clear(this_00);
  (this->mPackets).mTotalSize = 0;
  std::_Deque_base<AVPacket,_std::allocator<AVPacket>_>::~_Deque_base
            (&this_00->super__Deque_base<AVPacket,_std::allocator<AVPacket>_>);
  std::condition_variable::~condition_variable(&(this->mPackets).mCondVar);
  std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::~unique_ptr
            (&this->mCodecCtx);
  return;
}

Assistant:

~AudioState()
    {
        if(mSource)
            alDeleteSources(1, &mSource);
        if(mBuffers[0])
            alDeleteBuffers(static_cast<ALsizei>(mBuffers.size()), mBuffers.data());

        av_freep(&mSamples);
    }